

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O2

void __thiscall BinarySearchTree::caseA(BinarySearchTree *this,Node *par,Node *loc)

{
  if (par != (Node *)0x0) {
    this = (BinarySearchTree *)&par->rightChild;
    if (par->leftChild == loc) {
      this = (BinarySearchTree *)&par->leftChild;
    }
  }
  *this = (Node *)0x0;
  return;
}

Assistant:

void BinarySearchTree::caseA(Node *par, Node *loc) {
    if (par == nullptr) {
        root = nullptr;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = nullptr;
        } else {
            par->rightChild = nullptr;
        }
    }
}